

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCAABBTree.cpp
# Opt level: O3

int chrono::collision::build_recurse
              (CHAABBTree *m,int bn,int first_geo,int num_geos,double envelope)

{
  vector<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_> *__x;
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  pointer ppCVar6;
  ChGeometry *pCVar7;
  undefined8 uVar8;
  byte bVar9;
  bool bVar10;
  uint num_geos_00;
  CHAABBTree *m_00;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  long *plVar16;
  CHAABB *this;
  long lVar17;
  ulong uVar18;
  ushort uVar19;
  ushort uVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  Vector baricenter;
  double local_118;
  double dStack_110;
  double local_108;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  CHAABBTree *local_d8;
  ulong local_d0;
  long local_c8;
  vector<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_> local_c0;
  long local_a8;
  undefined8 uStack_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  long local_78;
  undefined8 uStack_70;
  long local_68;
  undefined8 uStack_60;
  long local_58;
  undefined8 uStack_50;
  undefined1 local_48 [24];
  
  __x = &(m->super_ChCollisionTree).geometries;
  local_c8 = (long)bn * 0x38;
  this = (m->b).
         super__Vector_base<chrono::collision::CHAABB,_std::allocator<chrono::collision::CHAABB>_>.
         _M_impl.super__Vector_impl_data._M_start + bn;
  std::vector<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>::
  vector(&local_c0,__x);
  CHAABB::FitToGeometries(this,&local_c0,first_geo,num_geos,envelope);
  if (local_c0.
      super__Vector_base<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.
                    super__Vector_base<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c0.
                          super__Vector_base<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.
                          super__Vector_base<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (num_geos == 1) {
    this->first_child = ~first_geo;
  }
  else if (1 < num_geos) {
    iVar5 = m->current_box;
    lVar17 = (long)first_geo;
    this->first_child = iVar5;
    m->current_box = iVar5 + 2;
    dVar1 = (this->d).m_data[0];
    local_88._8_8_ = 0;
    local_88._0_8_ = dVar1;
    dVar2 = (this->d).m_data[1];
    local_98._8_8_ = 0;
    local_98._0_8_ = dVar2;
    local_e8._8_8_ = 0;
    local_e8._0_8_ = VECT_X;
    plVar16 = (long *)&VECT_X;
    if (dVar1 < dVar2) {
      plVar16 = &VECT_Y;
    }
    local_f8._8_8_ = 0;
    local_f8._0_8_ = DAT_00b689c0;
    local_a8 = VECT_Y;
    uStack_a0 = 0;
    local_68 = DAT_00b689d8;
    uStack_60 = 0;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = (this->d).m_data[2];
    local_78 = VECT_Z;
    uStack_70 = 0;
    uVar8 = vcmppd_avx512vl(local_98,auVar22,1);
    uVar19 = (ushort)uVar8 & 3;
    uVar8 = vcmppd_avx512vl(local_88,auVar22,1);
    uVar20 = (ushort)uVar8 & 3;
    if (((uVar20 | uVar19) & 1) != 0) {
      plVar16 = &VECT_Z;
    }
    local_58 = DAT_00b689f0;
    uStack_50 = 0;
    dVar1 = (double)((ulong *)plVar16)[1];
    uVar13 = (ulong)(uint)num_geos;
    lVar15 = lVar17;
    uVar18 = uVar13;
    auVar26 = _VNULL;
    dVar2 = DAT_00b689a8;
    local_d8 = m;
    local_d0 = (ulong)(uint)first_geo;
    do {
      local_48._0_16_ = auVar26;
      (*(__x->
        super__Vector_base<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
        )._M_impl.super__Vector_impl_data._M_start[lVar15]->_vptr_ChGeometry[6])(&local_118);
      uVar11 = local_d0;
      lVar15 = lVar15 + 1;
      uVar18 = uVar18 - 1;
      auVar26._0_8_ = (double)local_48._0_8_ + local_118;
      auVar26._8_8_ = (double)local_48._8_8_ + dStack_110;
      dVar2 = dVar2 + local_108;
    } while (uVar18 != 0);
    bVar10 = (double)local_88._0_8_ < (double)local_98._0_8_;
    uVar14 = 0;
    bVar9 = (byte)uVar20 | (byte)uVar19;
    local_e8._0_8_ =
         (ulong)(bVar9 & 1) * local_78 +
         (ulong)!(bool)(bVar9 & 1) * ((ulong)bVar10 * local_a8 + (ulong)!bVar10 * local_e8._0_8_);
    local_f8._0_8_ =
         (ulong)(bVar9 & 1) * local_58 +
         (ulong)!(bool)(bVar9 & 1) * ((ulong)bVar10 * local_68 + (ulong)!bVar10 * local_f8._0_8_);
    dVar21 = (double)num_geos;
    auVar25._0_8_ = auVar26._0_8_ / dVar21;
    auVar25._8_8_ = auVar26._8_8_;
    auVar22 = vshufpd_avx(auVar26,auVar26,1);
    auVar23._0_8_ = dVar2 / dVar21;
    auVar23._8_8_ = 0;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = (auVar22._0_8_ / dVar21) * dVar1;
    auVar22 = vfmadd231sd_fma(auVar27,local_e8,auVar25);
    auVar22 = vfmadd231sd_fma(auVar22,local_f8,auVar23);
    do {
      (*(__x->
        super__Vector_base<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
        )._M_impl.super__Vector_impl_data._M_start[lVar17]->_vptr_ChGeometry[6])(&local_118);
      lVar15 = local_c8;
      m_00 = local_d8;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_118;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = dVar1 * dStack_110;
      auVar26 = vfmadd231sd_fma(auVar24,local_e8,auVar3);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_108;
      auVar26 = vfmadd231sd_fma(auVar26,local_f8,auVar4);
      iVar5 = (int)uVar11;
      if (auVar26._0_8_ <= auVar22._0_8_) {
        ppCVar6 = (__x->
                  super__Vector_base<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        iVar12 = uVar14 + iVar5;
        uVar14 = uVar14 + 1;
        pCVar7 = ppCVar6[lVar17];
        ppCVar6[lVar17] = ppCVar6[iVar12];
        (__x->
        super__Vector_base<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
        )._M_impl.super__Vector_impl_data._M_start[iVar12] = pCVar7;
      }
      lVar17 = lVar17 + 1;
      uVar13 = uVar13 - 1;
    } while (uVar13 != 0);
    num_geos_00 = uVar14;
    if (uVar14 == num_geos) {
      num_geos_00 = (uint)num_geos >> 1;
    }
    if (uVar14 == 0) {
      num_geos_00 = (uint)num_geos >> 1;
    }
    build_recurse(local_d8,*(int *)((long)(&((local_d8->b).
                                             super__Vector_base<chrono::collision::CHAABB,_std::allocator<chrono::collision::CHAABB>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->d + 1) +
                                   local_c8),iVar5,num_geos_00,envelope);
    build_recurse(m_00,*(int *)((long)(&((m_00->b).
                                         super__Vector_base<chrono::collision::CHAABB,_std::allocator<chrono::collision::CHAABB>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->d + 1) + lVar15
                               ) + 1,iVar5 + num_geos_00,num_geos - num_geos_00,envelope);
  }
  return 0;
}

Assistant:

int build_recurse(CHAABBTree* m, int bn, int first_geo, int num_geos, double envelope) {
    CHAABB* b = m->child(bn);

    double coord;
    Vector axis;
    Vector mean;

    // fit the BV

    b->FitToGeometries(m->geometries, first_geo, num_geos, envelope);

    if (num_geos == 1) {
        // BV is a leaf BV - first_child will index a triangle

        b->first_child = -(first_geo + 1);
    } else if (num_geos > 1) {
        // BV not a leaf - first_child will index a BV

        b->first_child = m->current_box;
        m->current_box += 2;

        // choose splitting axis

        axis = VECT_X;
        if (b->d.y() > b->d.x())
            axis = VECT_Y;
        if (b->d.z() > b->d.y())
            axis = VECT_Z;
        if (b->d.z() > b->d.x())
            axis = VECT_Z;

        // choose splitting coord

        get_centroid_geometries(mean, m->geometries, first_geo, num_geos);

        coord = Vdot(axis, mean);

        //*** TO DO***??? other splitting criterion??

        // now split

        int num_first_half = split_geometries(m->geometries, first_geo, num_geos, axis, coord);

        // recursively build the children

        build_recurse(m, m->child(bn)->first_child, first_geo, num_first_half, envelope);
        build_recurse(m, m->child(bn)->first_child + 1, first_geo + num_first_half, num_geos - num_first_half,
                      envelope);
    }

    return ChC_OK;
}